

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O2

qint64 __thiscall QHttpNetworkReply::bytesAvailableNextBlock(QHttpNetworkReply *this)

{
  long lVar1;
  bool bVar2;
  qint64 qVar3;
  
  lVar1 = *(long *)(this + 8);
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x168));
  if (bVar2) {
    qVar3 = QHttpNetworkConnectionPrivate::uncompressedBytesAvailableNextBlock
                      (*(QHttpNetworkConnectionPrivate **)(*(long *)(lVar1 + 0x170) + 8),
                       (QHttpNetworkReply *)this);
    return qVar3;
  }
  return -1;
}

Assistant:

qint64 QHttpNetworkReply::bytesAvailableNextBlock() const
{
    Q_D(const QHttpNetworkReply);
    if (d->connection)
        return d->connection->d_func()->uncompressedBytesAvailableNextBlock(*this);
    else
        return -1;
}